

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

void __thiscall
Json::Reader::addComment(Reader *this,Location begin,Location end,CommentPlacement placement)

{
  int in_ECX;
  long in_RDI;
  String *normalized;
  CommentPlacement in_stack_000001a4;
  String *in_stack_000001a8;
  Value *in_stack_000001b0;
  string local_68 [24];
  Location in_stack_ffffffffffffffb0;
  Location in_stack_ffffffffffffffb8;
  
  if ((*(byte *)(in_RDI + 0x10c) & 1) == 0) {
    __assert_fail("collectComments_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/jsoncpp/src/lib_json/json_reader.cpp"
                  ,0x17e,"void Json::Reader::addComment(Location, Location, CommentPlacement)");
  }
  normalizeEOL_abi_cxx11_(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (in_ECX == 1) {
    if (*(long *)(in_RDI + 0xe0) == 0) {
      __assert_fail("lastValue_ != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/jsoncpp/src/lib_json/json_reader.cpp"
                    ,0x181,"void Json::Reader::addComment(Location, Location, CommentPlacement)");
    }
    std::__cxx11::string::string(local_68,(string *)&stack0xffffffffffffffb8);
    Value::setComment(in_stack_000001b0,in_stack_000001a8,in_stack_000001a4);
    std::__cxx11::string::~string(local_68);
  }
  else {
    std::__cxx11::string::operator+=((string *)(in_RDI + 0xe8),(string *)&stack0xffffffffffffffb8);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

void Reader::addComment(Location begin,
                        Location end,
                        CommentPlacement placement) {
  assert(collectComments_);
  const String& normalized = normalizeEOL(begin, end);
  if (placement == commentAfterOnSameLine) {
    assert(lastValue_ != nullptr);
    lastValue_->setComment(normalized, placement);
  } else {
    commentsBefore_ += normalized;
  }
}